

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

bool Js::JavascriptStackWalker::AlignAndCheckAddressOfReturnAddressMatch
               (void *addressOfReturnAddress,void *nativeLibraryEntryAddress)

{
  void *nativeLibraryEntryAddress_local;
  void *addressOfReturnAddress_local;
  
  return addressOfReturnAddress == nativeLibraryEntryAddress;
}

Assistant:

bool JavascriptStackWalker::AlignAndCheckAddressOfReturnAddressMatch(void* addressOfReturnAddress, void* nativeLibraryEntryAddress)
    {
        return addressOfReturnAddress == nativeLibraryEntryAddress
#if defined(_M_IX86)
            // Under some odd cases on x86, addressOfReturnAddress and stashed entry address need to be aligned.
            // This happens when code is generated using two stack pointers. One or both have the address of
            // return address offset by 4, 8, or 12.
            || (((uint)nativeLibraryEntryAddress - (uint)addressOfReturnAddress < 0x10) &&
                *(void**)addressOfReturnAddress == *(void**)nativeLibraryEntryAddress
                )
#endif
            ;
    }